

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

wchar_t prompt_for_easy_filter(equippable_summary *s,_Bool apply_not)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  equippable_expr *peVar3;
  equippable_expr *peVar4;
  bool bVar5;
  undefined4 uVar6;
  equippable_selfunc_extra eVar7;
  _Bool _Var8;
  bool bVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t extraout_EAX;
  undefined7 extraout_var;
  __int32_t **pp_Var12;
  __int32_t *p_Var13;
  size_t sVar14;
  code *pcVar15;
  wchar_t wVar16;
  undefined1 *puVar17;
  code *pcVar18;
  char cVar19;
  undefined1 *puVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  prop_category *ppVar25;
  char local_78;
  undefined1 local_77 [3];
  char c [4];
  wchar_t wc [4];
  wchar_t wce [4];
  
  c[0] = '\0';
  c[1] = '\0';
  c[2] = '\0';
  c[3] = '\0';
  _Var8 = get_string("Enter 2 or 3 (for stat) character code and return or return to clear ",c,4);
  wVar10 = (wchar_t)CONCAT71(extraout_var,_Var8);
  if (_Var8) {
    if (c[0] == '\0') {
      s->config_filt_is_on = false;
      wVar2 = (s->easy_filt).nv;
      wVar10 = get_expected_easy_filter_count(s->stores);
      if (wVar10 < wVar2) {
        peVar3 = (s->easy_filt).v;
        lVar22 = (long)(s->easy_filt).nv;
        uVar6 = *(undefined4 *)&peVar3[lVar22].field_0x14;
        peVar3[lVar22 + -1].c = peVar3[lVar22].c;
        *(undefined4 *)&peVar3[lVar22 + -1].field_0x14 = uVar6;
        peVar4 = peVar3 + lVar22;
        eVar7 = (peVar4->s).ex;
        uVar6 = *(undefined4 *)&(peVar4->s).field_0xc;
        peVar3 = peVar3 + lVar22 + -1;
        (peVar3->s).func = (peVar4->s).func;
        (peVar3->s).ex = eVar7;
        *(undefined4 *)&(peVar3->s).field_0xc = uVar6;
        pwVar1 = &(s->easy_filt).nv;
        *pwVar1 = *pwVar1 + L'\xffffffff';
        filter_items(s);
LAB_001c068e:
        sort_items(s);
        wVar10 = extraout_EAX;
      }
    }
    else {
      bVar5 = false;
      for (uVar24 = 0; (uVar24 < 4 && (!(bool)(uVar24 == 3 & bVar5))); uVar24 = uVar24 + 1) {
        lVar22 = (long)c[0];
        switch(uVar24) {
        case 0:
          pp_Var12 = __ctype_toupper_loc();
          local_78 = (char)(*pp_Var12)[lVar22];
          lVar22 = (long)c[1];
          if (lVar22 == 0) goto LAB_001c047c;
          pp_Var12 = __ctype_tolower_loc();
          p_Var13 = *pp_Var12;
          local_77[0] = (undefined1)p_Var13[lVar22];
          goto LAB_001c044f;
        case 1:
          pp_Var12 = __ctype_toupper_loc();
          break;
        case 2:
          pp_Var12 = __ctype_tolower_loc();
          break;
        case 3:
          pp_Var12 = __ctype_tolower_loc();
          local_78 = (char)(*pp_Var12)[lVar22];
          cVar19 = c[1];
          if (c[1] == '\0') goto LAB_001c047c;
          pp_Var12 = __ctype_toupper_loc();
          p_Var13 = *pp_Var12;
          puVar17 = local_77;
          puVar20 = local_77 + 1;
          bVar9 = bVar5;
          goto LAB_001c046c;
        }
        p_Var13 = *pp_Var12;
        local_78 = (char)p_Var13[lVar22];
        if ((long)c[1] == 0) {
LAB_001c047c:
          puVar17 = local_77;
        }
        else {
          local_77[0] = (undefined1)p_Var13[c[1]];
LAB_001c044f:
          puVar17 = local_77 + 1;
          puVar20 = local_77 + 2;
          cVar19 = c[2];
          bVar9 = true;
          if (c[2] != '\0') {
LAB_001c046c:
            bVar5 = bVar9;
            *puVar17 = (char)p_Var13[cVar19];
            puVar17 = puVar20;
          }
        }
        *puVar17 = 0;
        sVar14 = text_mbstowcs(wc,&local_78,L'\x04');
        if (sVar14 != 0xffffffffffffffff) {
          uVar23 = 0;
          do {
            uVar21 = (uint)uVar23;
            ppVar25 = s->propcats + uVar23;
            bVar9 = true;
            wVar10 = L'\0';
LAB_001c04b7:
            if ((!bVar9) || (4 < uVar21)) {
LAB_001c052f:
              if (4 < uVar21) break;
              s->config_filt_is_on = false;
              wVar2 = (s->easy_filt).nv;
              wVar11 = get_expected_easy_filter_count(s->stores);
              wVar16 = (s->easy_filt).nv;
              peVar4 = (s->easy_filt).v;
              if (wVar2 == wVar11) {
                peVar4[wVar16].c = EQUIP_EXPR_SELECTOR;
                wVar16 = wVar16 + L'\x01';
                (s->easy_filt).nv = wVar16;
              }
              peVar4[wVar16 + L'\xffffffff'].s.ex.src = wVar10 + s->propcats[uVar23].off;
              switch(uVar23) {
              case 0:
                pcVar18 = sel_does_not_resist;
                pcVar15 = sel_at_least_resists;
                break;
              case 1:
                pcVar18 = sel_does_not_have_flag;
                pcVar15 = sel_has_flag;
                break;
              case 2:
                pcVar18 = sel_has_flag;
                pcVar15 = sel_does_not_have_flag;
                break;
              case 3:
              case 4:
                pcVar18 = sel_has_nonpos_mod;
                pcVar15 = sel_has_pos_mod;
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                              ,0x59f,
                              "int prompt_for_easy_filter(struct equippable_summary *, _Bool)");
              }
              if (apply_not) {
                pcVar15 = pcVar18;
              }
              (s->easy_filt).v[wVar16 + L'\xffffffff'].s.func = pcVar15;
              filter_items(s);
              goto LAB_001c068e;
            }
            if (wVar10 < ppVar25->n) {
              if (bVar5) {
                get_ui_entry_label(ppVar25->entries[wVar10],L'\x04',false,wce);
                if (((wc[0] != wce[0]) || (wc[1] != wce[1])) || (wc[2] != wce[2]))
                goto LAB_001c0520;
                bVar9 = false;
              }
              else {
                if ((wc[0] == *ppVar25->labels[wVar10]) && (wc[1] == ppVar25->labels[wVar10][1]))
                goto LAB_001c052f;
LAB_001c0520:
                wVar10 = wVar10 + L'\x01';
                bVar9 = true;
              }
              goto LAB_001c04b7;
            }
            uVar23 = (ulong)(uVar21 + 1);
          } while( true );
        }
      }
      wVar10 = L'\x002645bb';
      s->dlg_trans_msg = "Did not find attribute with that name; filter unchanged";
    }
  }
  return wVar10;
}

Assistant:

static int prompt_for_easy_filter(struct equippable_summary *s, bool apply_not)
{
	static const char *no_matching_attribute_msg =
		"Did not find attribute with that name; filter unchanged";
	char c[4] = "";
	int itry;
	bool threec;

	if (! get_string("Enter 2 or 3 (for stat) character code and return or return to clear ", c,
		N_ELEMENTS(c))) {
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/* Clear the current filter. */
	if (c[0] == '\0') {
		s->config_filt_is_on = false;
		if (s->easy_filt.nv >
				get_expected_easy_filter_count(s->stores)) {
			s->easy_filt.v[s->easy_filt.nv - 1] =
				s->easy_filt.v[s->easy_filt.nv];
			--s->easy_filt.nv;
			filter_items(s);
			sort_items(s);
		}
		return EQUIP_CMP_MENU_NEW_PAGE;
	}

	/*
	 * Try different combinations of capitalization to match the
	 * entered string to one of the column labels.
	 */
	itry = 0;
	threec = false;
	while (1) {
		char ctry[4];
		wchar_t wc[4];

		if (itry >= 4 || (threec && itry >= 3)) {
			s->dlg_trans_msg = no_matching_attribute_msg;
			break;
		}
		switch (itry) {
		case 0:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 1:
			ctry[0] = toupper(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				if (c[2] != '\0') {
					ctry[2] = toupper(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 2:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = tolower(c[1]);
				if (c[2] != '\0') {
					ctry[2] = tolower(c[2]);
					ctry[3] = '\0';
					threec = true;
				} else {
					ctry[2] = '\0';
				}
			} else {
				ctry[1] = '\0';
			}
			break;

		case 3:
			ctry[0] = tolower(c[0]);
			if (c[1] != '\0') {
				ctry[1] = toupper(c[1]);
				ctry[2] = '\0';
			} else {
				ctry[1] = '\0';
			}
			break;
		}

		if (text_mbstowcs(wc, ctry, N_ELEMENTS(wc)) != (size_t)-1) {
			int j = 0, k = 0;
			bool search = true;

			while (search) {
				if (j < (int)N_ELEMENTS(s->propcats)) {
					if (k < s->propcats[j].n) {
						if (threec) {
							wchar_t wce[4];

							get_ui_entry_label(s->propcats[j].entries[k], 4, false, wce);
							if (wc[0] == wce[0] &&
							    wc[1] == wce[1] &&
							    wc[2] == wce[2]) {
								search = false;
							} else {
								++k;
							}
						} else if (wc[0] == s->propcats[j].labels[k][0] &&
							wc[1] == s->propcats[j].labels[k][1]) {
							search = false;
						} else {
							++k;
						}
					} else {
						k = 0;
						++j;
					}
				} else {
					search = false;
				}
			}

			/* Configure the new filter and apply it. */
			if (j < (int)N_ELEMENTS(s->propcats)) {
				int ind;

				s->config_filt_is_on = false;
				if (s->easy_filt.nv ==
						get_expected_easy_filter_count(s->stores)) {
					s->easy_filt.v[s->easy_filt.nv].c =
						EQUIP_EXPR_SELECTOR;
					++s->easy_filt.nv;
				}
				ind = s->easy_filt.nv - 1;
				s->easy_filt.v[ind].s.ex.propind =
					s->propcats[j].off + k;
				switch (j) {
				case 0:
					/* Resistance */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_resist :
						sel_at_least_resists;
					break;

				case 1:
					/*
					 * A boolean flag where on is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_does_not_have_flag :
						sel_has_flag;
					break;

				case 2:
					/*
					 * A boolean flag where off is usually
					 * preferred.
					 */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_flag :
						sel_does_not_have_flag;
					break;

				case 3:
				case 4:
					/* Integer modifier. */
					s->easy_filt.v[ind].s.func =
						(apply_not) ?
						sel_has_nonpos_mod :
						sel_has_pos_mod;
					break;

				default:
					assert(0);
				}

				filter_items(s);
				sort_items(s);
				break;
			}
		}

		++itry;
	}
	return EQUIP_CMP_MENU_NEW_PAGE;
}